

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManCSPassiveClauseContainer.cpp
# Opt level: O3

Clause * __thiscall
Saturation::ManCSPassiveClauseContainer::popSelected(ManCSPassiveClauseContainer *this)

{
  int iVar1;
  Clause *pCVar2;
  char *__nptr;
  uint uVar3;
  int *piVar4;
  long lVar5;
  ostream *poVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  HandlerList *pHVar9;
  ulong uVar10;
  pointer __dest;
  bool bVar11;
  string id;
  char *local_58;
  long local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pick a clause:\n",0xf)
    ;
    local_50 = 0;
    local_48 = '\0';
    local_58 = &local_48;
    std::operator>>((istream *)&std::cin,(string *)&local_58);
    __nptr = local_58;
    piVar4 = __errno_location();
    iVar1 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol(__nptr,&local_38,10);
    if (local_38 == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_0066d01f:
      std::__throw_out_of_range("stoi");
    }
    uVar3 = (uint)lVar5;
    if (((int)uVar3 != lVar5) || (*piVar4 == 0x22)) goto LAB_0066d01f;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    ppCVar8 = (this->clauses).
              super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __dest = (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)__dest - (long)ppCVar8;
    if (0 < (long)uVar10 >> 5) {
      ppCVar7 = (pointer)((uVar10 & 0xffffffffffffffe0) + (long)ppCVar8);
      lVar5 = ((long)uVar10 >> 5) + 1;
      ppCVar8 = ppCVar8 + 2;
      do {
        if ((ppCVar8[-2]->super_Unit)._number == uVar3) {
          ppCVar8 = ppCVar8 + -2;
          goto LAB_0066cf5b;
        }
        if ((ppCVar8[-1]->super_Unit)._number == uVar3) {
          ppCVar8 = ppCVar8 + -1;
          goto LAB_0066cf5b;
        }
        if (((*ppCVar8)->super_Unit)._number == uVar3) goto LAB_0066cf5b;
        if ((ppCVar8[1]->super_Unit)._number == uVar3) {
          ppCVar8 = ppCVar8 + 1;
          goto LAB_0066cf5b;
        }
        lVar5 = lVar5 + -1;
        ppCVar8 = ppCVar8 + 4;
      } while (1 < lVar5);
      uVar10 = (long)__dest - (long)ppCVar7;
      ppCVar8 = ppCVar7;
    }
    lVar5 = (long)uVar10 >> 3;
    if (lVar5 == 1) {
LAB_0066cf38:
      if (((*ppCVar8)->super_Unit)._number != uVar3) {
        ppCVar8 = __dest;
      }
LAB_0066cf5b:
      bVar11 = ppCVar8 == __dest;
      __dest = ppCVar8;
      if (bVar11) goto LAB_0066cf64;
      bVar11 = false;
    }
    else {
      if (lVar5 == 2) {
LAB_0066cf2d:
        if (((*ppCVar8)->super_Unit)._number != uVar3) {
          ppCVar8 = ppCVar8 + 1;
          goto LAB_0066cf38;
        }
        goto LAB_0066cf5b;
      }
      if (lVar5 == 3) {
        if (((*ppCVar8)->super_Unit)._number != uVar3) {
          ppCVar8 = ppCVar8 + 1;
          goto LAB_0066cf2d;
        }
        goto LAB_0066cf5b;
      }
LAB_0066cf64:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"User error: No clause in Passive has id ",0x28);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_58,local_50);
      bVar11 = true;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"!\n",2);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    if (!bVar11) {
      pCVar2 = *__dest;
      ppCVar8 = __dest + 1;
      ppCVar7 = (this->clauses).
                super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar8 != ppCVar7) {
        memmove(__dest,ppCVar8,(long)ppCVar7 - (long)ppCVar8);
        ppCVar7 = (this->clauses).
                  super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      (this->clauses).super__Vector_base<Kernel::Clause_*,_std::allocator<Kernel::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppCVar7 + -1;
      for (pHVar9 = (this->super_PassiveClauseContainer).super_RandomAccessClauseContainer.
                    super_ClauseContainer.selectedEvent.super_BaseEvent._handlers;
          pHVar9 != (HandlerList *)0x0; pHVar9 = pHVar9->_tail) {
        (*pHVar9->_head->_vptr_HandlerStruct[2])(pHVar9->_head,pCVar2);
      }
      return pCVar2;
    }
  } while( true );
}

Assistant:

Clause* ManCSPassiveClauseContainer::popSelected()
{
  ASS(!clauses.empty());

  std::vector<Clause*>::iterator selectedClauseIt;
  while(true)
  {
    // ask user to pick a clause id
    std::cout << "Pick a clause:\n";
    std::string id;
    std::cin >> id;
    unsigned selectedId = std::stoi(id);

    // search clause with that id
    selectedClauseIt = std::find_if(clauses.begin(), clauses.end(), 
      [&](Clause* c) -> bool { return c->number() == selectedId; });
    if(selectedClauseIt != clauses.end())
    {
      break;
    }
    else
    {
      std::cout << "User error: No clause in Passive has id " << id << "!\n";
    }
  }

  auto selectedClause	= *selectedClauseIt;
  clauses.erase(selectedClauseIt);
  selectedEvent.fire(selectedClause);

  return selectedClause;
}